

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::enterInitializingModeIterativeComplete(Federate *this)

{
  Modes MVar1;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *psVar2;
  InvalidFunctionCall *this_00;
  string_view message;
  handle asyncInfo;
  unique_lock<std::mutex> local_28;
  
  MVar1 = (this->currentMode)._M_i;
  if (MVar1 != STARTUP) {
    if (MVar1 != PENDING_ITERATIVE_INIT) {
      this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      message._M_str =
           "cannot call enterInitializingModeIterativeComplete function without first calling enterInitializingModeIterativeAsync function "
      ;
      message._M_len = 0x7f;
      InvalidFunctionCall::InvalidFunctionCall(this_00,message);
      __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
    }
    psVar2 = (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl;
    local_28._M_device = &psVar2->m_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    std::future<void>::get(&(psVar2->m_obj).initIterativeFuture);
    updateFederateMode(this,STARTUP);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  return;
}

Assistant:

void Federate::enteringInitializingMode(IterationResult iterating)
{
    updateFederateMode(Modes::INITIALIZING);
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (iterating == IterationResult::NEXT_STEP) {
        startupToInitializeStateTransition();
    }
    if (initializingEntryCallback) {
        initializingEntryCallback(iterating != IterationResult::NEXT_STEP);
    }
}